

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

bool embree::test_location
               (vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                *in,ssize_t ipos,
               vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               *out,ssize_t opos)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  float *pfVar4;
  float *pfVar5;
  pointer pvVar6;
  pointer pvVar7;
  undefined1 auVar8 [16];
  long lVar9;
  int unaff_EBP;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  if (opos < 0) {
    return false;
  }
  lVar1 = ipos + 4;
  pvVar6 = (out->
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = (in->
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (; (ipos < lVar1 && (opos < (long)pvVar6->size_active)); opos = opos + 1) {
    lVar10 = 0x18;
    lVar9 = ((long)(in->
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 5) + 1;
    while (lVar9 = lVar9 + -1, lVar9 != 0) {
      plVar2 = (long *)(&pvVar7->field_0x0 + lVar10);
      plVar3 = (long *)(&pvVar6->field_0x0 + lVar10);
      lVar10 = lVar10 + 0x20;
      pfVar4 = (float *)(*plVar2 + ipos * 0x10);
      pfVar5 = (float *)(*plVar3 + opos * 0x10);
      auVar11._0_8_ = *(ulong *)pfVar4 & 0x7fffffff7fffffff;
      auVar11._8_4_ = ABS(pfVar4[2]);
      auVar11._12_4_ = ABS(pfVar4[3]);
      auVar12._8_4_ = ABS(pfVar5[2]);
      auVar12._0_8_ = *(ulong *)pfVar5 & 0x7fffffff7fffffff;
      auVar12._12_4_ = ABS(pfVar5[3]);
      auVar12 = maxps(auVar11,auVar12);
      auVar8._4_4_ = -(uint)(auVar12._4_4_ * 0.01 < ABS(pfVar4[1] - pfVar5[1]));
      auVar8._0_4_ = -(uint)(auVar12._0_4_ * 0.01 < ABS(*pfVar4 - *pfVar5));
      auVar8._8_4_ = -(uint)(auVar12._8_4_ * 0.01 < ABS(pfVar4[2] - pfVar5[2]));
      auVar8._12_4_ = -(uint)(auVar12._12_4_ * 0.01 < ABS(pfVar4[3] - pfVar5[3]));
      unaff_EBP = movmskps(unaff_EBP,auVar8);
      if (unaff_EBP != 0) {
        return false;
      }
    }
    ipos = ipos + 1;
  }
  return true;
}

Assistant:

bool test_location(const std::vector<avector<Vec3ff>>& in, ssize_t ipos, std::vector<avector<Vec3ff>>& out, ssize_t opos)
  {
    if (opos < 0) 
      return false;

    for (ssize_t i=ipos, j=opos; i<ipos+4 && j<(ssize_t)out[0].size(); i++, j++) {
      for (size_t k=0; k<in.size(); k++) {
        if (any(abs((vfloat4)in[k][i].m128-(vfloat4)out[k][j].m128) > 0.01f*(vfloat4)max(abs(in[k][i]),abs(out[k][j])).m128))
          return false;
      }
    }
    return true;
  }